

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O3

string * __thiscall
leveldb::ParsedInternalKey::DebugString_abi_cxx11_
          (string *__return_storage_ptr__,ParsedInternalKey *this)

{
  char *pcVar1;
  ostream *poVar2;
  Slice *value;
  ostringstream ss;
  string local_1e8;
  undefined1 *local_1c8;
  undefined8 uStack_1c0;
  undefined1 local_1b8 [16];
  undefined1 *local_1a8;
  undefined8 uStack_1a0;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  local_1e8._M_dataplus._M_p._0_1_ = 0x27;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,(char *)&local_1e8,1);
  pcVar1 = (this->user_key).data_;
  local_1c8 = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1c8,pcVar1,pcVar1 + (this->user_key).size_);
  local_1a8 = local_1c8;
  uStack_1a0 = uStack_1c0;
  EscapeString_abi_cxx11_(&local_1e8,(leveldb *)&local_1a8,value);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)CONCAT71(local_1e8._M_dataplus._M_p._1_7_,
                                              local_1e8._M_dataplus._M_p._0_1_),
                      local_1e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' @ ",4);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," : ",3);
  std::ostream::operator<<(poVar2,this->type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1e8._M_dataplus._M_p._1_7_,local_1e8._M_dataplus._M_p._0_1_) !=
      &local_1e8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_1e8._M_dataplus._M_p._1_7_,local_1e8._M_dataplus._M_p._0_1_));
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string ParsedInternalKey::DebugString() const {
  std::ostringstream ss;
  ss << '\'' << EscapeString(user_key.ToString()) << "' @ " << sequence << " : "
     << static_cast<int>(type);
  return ss.str();
}